

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd.cpp
# Opt level: O0

char * __thiscall bp_osd::osd_post_process(bp_osd *this,double *soft_decisions,char *synd)

{
  ostream *this_00;
  void *this_01;
  long in_RDI;
  int in_stack_00000014;
  double *in_stack_00000018;
  int in_stack_0000006c;
  double *in_stack_00000070;
  char *in_stack_00000078;
  char *in_stack_00000080;
  undefined4 in_stack_00000088;
  int in_stack_0000008c;
  mod2sparse *in_stack_00000090;
  char *in_stack_00000098;
  int in_stack_000000a0;
  undefined4 in_stack_000000a4;
  char **in_stack_000000a8;
  int in_stack_000000b0;
  undefined4 in_stack_000000b4;
  int in_stack_000000c0;
  
  if ((*(int *)(in_RDI + 0x48) == 0) || (*(int *)(in_RDI + 0x48) == 1)) {
    osd_w(in_stack_00000090,(char *)CONCAT44(in_stack_0000008c,in_stack_00000088),in_stack_00000080,
          in_stack_00000078,in_stack_00000070,in_stack_0000006c,in_stack_000000a0,in_stack_000000a8,
          in_stack_000000b0);
  }
  else if (*(int *)(in_RDI + 0x48) == 2) {
    osd_0((mod2sparse *)this,(char *)soft_decisions,synd,in_stack_00000018,in_stack_00000014);
    *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(in_RDI + 0x58);
  }
  else {
    if (*(int *)(in_RDI + 0x48) != 3) {
      this_00 = std::operator<<((ostream *)&std::cout,
                                "ERROR. <Function bp_osd::osd_post_process>. Invalid OSD method! Method: "
                               );
      this_01 = (void *)std::ostream::operator<<(this_00,*(int *)(in_RDI + 0x48));
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      exit(0x16);
    }
    osd_g((mod2sparse *)CONCAT44(in_stack_000000b4,in_stack_000000b0),(char *)in_stack_000000a8,
          (char *)CONCAT44(in_stack_000000a4,in_stack_000000a0),in_stack_00000098,
          (double *)in_stack_00000090,in_stack_0000008c,in_stack_000000c0);
  }
  return *(char **)(in_RDI + 0x60);
}

Assistant:

char *bp_osd::osd_post_process(double *soft_decisions, char *synd){

    if((osd_method==0)||(osd_method==1))
        osd_w(
                H,
                synd,
                osd0_decoding,
                osdw_decoding,
                soft_decisions,
                osd_order, rank,
                osd_w_encoding_inputs,
                encoding_input_count
        );

    else if(osd_method==2){
        osd_0(
                H,
                synd,
                osd0_decoding,
                soft_decisions,
                rank
        );
        osdw_decoding=osd0_decoding;
    }

    else if(osd_method==3){
        osd_g(
                H,
                synd,
                osd0_decoding,
                osdw_decoding,
                soft_decisions,
                osd_order,
                rank
        );
    }

    else {
        cout << "ERROR. <Function bp_osd::osd_post_process>. Invalid OSD method! Method: "<<osd_method << endl;
        exit(22);
    }

    return osdw_decoding;

}